

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdNode * Cudd_addComputeCube(DdManager *dd,DdNode **vars,int *phase,int n)

{
  DdNode *g;
  int local_4c;
  DdNode *pDStack_48;
  int i;
  DdNode *fn;
  DdNode *zero;
  DdNode *cube;
  int n_local;
  int *phase_local;
  DdNode **vars_local;
  DdManager *dd_local;
  
  zero = dd->one;
  *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) =
       *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) + 1;
  g = dd->zero;
  local_4c = n + -1;
  while( true ) {
    if (local_4c < 0) {
      *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) + -1;
      return zero;
    }
    if ((phase == (int *)0x0) || (phase[local_4c] != 0)) {
      pDStack_48 = Cudd_addIte(dd,vars[local_4c],zero,g);
    }
    else {
      pDStack_48 = Cudd_addIte(dd,vars[local_4c],g,zero);
    }
    if (pDStack_48 == (DdNode *)0x0) break;
    *(int *)(((ulong)pDStack_48 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDStack_48 & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(dd,zero);
    zero = pDStack_48;
    local_4c = local_4c + -1;
  }
  Cudd_RecursiveDeref(dd,zero);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addComputeCube(
  DdManager * dd,
  DdNode ** vars,
  int * phase,
  int  n)
{
    DdNode      *cube, *zero;
    DdNode      *fn;
    int         i;

    cube = DD_ONE(dd);
    cuddRef(cube);
    zero = DD_ZERO(dd);

    for (i = n - 1; i >= 0; i--) {
        if (phase == NULL || phase[i] != 0) {
            fn = Cudd_addIte(dd,vars[i],cube,zero);
        } else {
            fn = Cudd_addIte(dd,vars[i],zero,cube);
        }
        if (fn == NULL) {
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(fn);
        Cudd_RecursiveDeref(dd,cube);
        cube = fn;
    }
    cuddDeref(cube);

    return(cube);

}